

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O0

ValueCallback * __thiscall
SNMPAgent::addTimestampHandler
          (SNMPAgent *this,char *oid,uint32_t *value,bool isSettable,bool overwritePrefix)

{
  SortableOIDType *oid_00;
  TimestampCallback *this_00;
  SortableOIDType *oidType;
  bool overwritePrefix_local;
  bool isSettable_local;
  uint32_t *value_local;
  char *oid_local;
  SNMPAgent *this_local;
  
  if (value == (uint32_t *)0x0) {
    this_local = (SNMPAgent *)0x0;
  }
  else {
    oid_00 = buildOIDWithPrefix(this,oid,overwritePrefix);
    if (oid_00 == (SortableOIDType *)0x0) {
      this_local = (SNMPAgent *)0x0;
    }
    else {
      this_00 = (TimestampCallback *)operator_new(0x20);
      TimestampCallback::TimestampCallback(this_00,oid_00,value);
      this_local = (SNMPAgent *)addHandler(this,(ValueCallback *)this_00,isSettable);
    }
  }
  return (ValueCallback *)this_local;
}

Assistant:

ValueCallback* SNMPAgent::addTimestampHandler(const char *oid, uint32_t* value, bool isSettable, bool overwritePrefix){
    if(!value) return nullptr;

    SortableOIDType* oidType = buildOIDWithPrefix(oid, overwritePrefix);
    if(!oidType) return nullptr;
    return addHandler(new TimestampCallback(oidType, value), isSettable);
}